

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_avx512::create_pipeline(Deconvolution_x86_avx512 *this,Option *opt)

{
  uint _c;
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  Allocator *pAVar6;
  undefined4 *puVar7;
  ulong uVar8;
  int p;
  long lVar9;
  ulong uVar10;
  int i;
  int iVar11;
  _func_int *p_Var12;
  ulong uVar13;
  int k;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  undefined4 *puVar20;
  int _w;
  ulong uVar21;
  Mat local_c0;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  undefined1 auStack_48 [12];
  size_t local_38;
  
  p_Var12 = this->_vptr_Deconvolution_x86_avx512[-3];
  uVar21 = (long)*(int *)(&this->field_0xd8 + (long)p_Var12) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var12);
  _w = (int)uVar21;
  uVar8 = (long)*(int *)(&this->field_0x110 + (long)p_Var12) / (long)_w;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
          (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
  local_38 = 0;
  local_78._0_8_ = (Allocator *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  iVar18 = 0;
  local_58 = (Allocator *)local_78._0_8_;
  iStack_50 = local_78._8_4_;
  iStack_4c = local_78._12_4_;
  auStack_48 = local_78._16_12_;
  Mat::create((Mat *)local_78,*(int *)(&this->field_0x18c + (long)p_Var12),4,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86_avx512;
  p_Var12 = pp_Var1[-3];
  lVar9 = *(long *)(&this->field_0x160 + (long)p_Var12);
  uVar17 = 0;
  if (0 < _w) {
    uVar17 = uVar21 & 0xffffffff;
  }
  pAVar6 = (Allocator *)local_78._0_8_;
  while( true ) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var12);
    iVar11 = (int)uVar8;
    if ((int)(_c * iVar11) <= iVar18) break;
    iVar11 = _w;
    for (uVar14 = 0; iVar11 = iVar11 + -1, uVar17 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined4 *)((long)&pAVar6->_vptr_Allocator + (long)iVar11 * 4) =
           *(undefined4 *)(lVar9 + uVar14 * 4);
    }
    pAVar6 = (Allocator *)((long)&pAVar6->_vptr_Allocator + uVar21 * 4);
    iVar18 = iVar18 + 1;
    p_Var12 = pp_Var1[-3];
    lVar9 = lVar9 + uVar21 * 4;
  }
  if (opt->use_packing_layout == false) {
    uVar19 = 1;
    uVar21 = 1;
  }
  else {
    uVar21 = 0x10;
    uVar19 = 0x10;
    if ((uVar8 & 0xf) != 0) {
      if ((uVar8 & 7) == 0) {
        uVar19 = 8;
      }
      else {
        uVar19 = (uint)((uVar8 & 3) == 0) * 3 + 1;
      }
    }
    if ((_c & 0xf) != 0) {
      if ((_c & 7) == 0) {
        uVar21 = 8;
      }
      else {
        uVar21 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
      }
    }
  }
  Mat::reshape(&local_c0,(Mat *)local_78,_w,iVar11,_c,(Allocator *)0x0);
  iVar18 = (int)uVar21;
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                   (long)(int)uVar19),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) / iVar18,
              (ulong)(iVar18 * uVar19 * 4),iVar18 * uVar19,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86_avx512;
  pvVar2 = (this->weight_data_tm).data;
  sVar3 = (this->weight_data_tm).cstep;
  sVar4 = (this->weight_data_tm).elemsize;
  for (uVar8 = 0;
      (long)((iVar18 - 1) + uVar8) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var1[-3]);
      uVar8 = uVar8 + uVar21) {
    puVar7 = (undefined4 *)(((uVar8 & 0xffffffff) / uVar21) * sVar3 * sVar4 + (long)pvVar2);
    for (lVar9 = 0; lVar9 < (long)((long)iVar11 - (ulong)(uVar19 - 1));
        lVar9 = lVar9 + (ulong)uVar19) {
      puVar15 = (undefined4 *)
                ((local_c0.w * lVar9 + uVar8 * local_c0.cstep) * local_c0.elemsize +
                (long)local_c0.data);
      for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        puVar16 = puVar15;
        for (uVar13 = 0; uVar10 = uVar21, puVar20 = puVar16, uVar13 != uVar19; uVar13 = uVar13 + 1)
        {
          while (uVar10 != 0) {
            *puVar7 = *puVar20;
            puVar7 = puVar7 + 1;
            uVar10 = uVar10 - 1;
            puVar20 = (undefined4 *)((long)puVar20 + local_c0.cstep * local_c0.elemsize);
          }
          puVar16 = (undefined4 *)((long)puVar16 + local_c0.elemsize * (long)local_c0.w);
        }
        puVar15 = puVar15 + 1;
      }
    }
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        free(local_c0.data);
      }
      else {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var12 = this->_vptr_Deconvolution_x86_avx512[-3];
    piVar5 = *(int **)(&this->field_0x168 + (long)p_Var12);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var12) == (long *)0x0) {
          free(*(void **)(&this->field_0x160 + (long)p_Var12));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var12) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var12) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var12) = 0;
  }
  piVar5 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_58 == (Allocator *)0x0) {
        free((void *)local_78._0_8_);
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx512::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}